

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hrec_t * bcf_hdr_parse_line(bcf_hdr_t *h,char *line,int *len)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  bcf_hrec_t *hrec;
  char *pcVar4;
  ushort **ppuVar5;
  char *pcVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  int len_00;
  size_t __n;
  ulong uVar12;
  bool bVar13;
  kstring_t tmp;
  
  if ((*line == '#') && (line[1] == '#')) {
    lVar10 = 0;
    for (lVar9 = 0; (cVar3 = line[lVar9 + 2], cVar3 != '\0' && (cVar3 != '=')); lVar9 = lVar9 + 1) {
      lVar10 = lVar10 + 0x100000000;
    }
    if (cVar3 == '=' && (int)lVar9 != 0) {
      hrec = (bcf_hrec_t *)calloc(1,0x30);
      pcVar4 = (char *)malloc(lVar10 + 0x100000000 >> 0x20);
      hrec->key = pcVar4;
      memcpy(pcVar4,line + 2,lVar10 >> 0x20);
      pcVar4[lVar10 >> 0x20] = '\0';
      pcVar4 = line + lVar9 + 3;
      cVar3 = *pcVar4;
      if (cVar3 != '<') {
        lVar9 = lVar9 + 4;
        __n = 0;
        while ((cVar3 != '\0' && (cVar3 != '\n'))) {
          pcVar6 = line + lVar9;
          lVar9 = lVar9 + 1;
          __n = __n + 1;
          cVar3 = *pcVar6;
        }
        pcVar6 = (char *)malloc(__n + 1);
        hrec->value = pcVar6;
        memcpy(pcVar6,pcVar4,__n);
        pcVar6[__n] = '\0';
        *len = (int)lVar9;
        return hrec;
      }
      iVar8 = 1;
      cVar3 = '<';
      while( true ) {
        if (((cVar3 == '\0') || (cVar3 == '\n')) || (iVar8 == 0)) {
          *len = ((int)pcVar4 - (int)line) + 1;
          return hrec;
        }
        lVar9 = 0;
        while( true ) {
          cVar3 = pcVar4[lVar9 + 1];
          uVar12 = (ulong)cVar3;
          if ((uVar12 == 0) || (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[uVar12] & 8) == 0)) break;
          lVar9 = lVar9 + 1;
        }
        len_00 = (int)lVar9;
        if ((cVar3 != '=') || (len_00 == 0)) break;
        bcf_hrec_add_key(hrec,pcVar4 + 1,len_00);
        cVar3 = pcVar4[lVar9 + 2];
        pcVar6 = pcVar4 + lVar9 + 3;
        if (cVar3 != '\"') {
          pcVar6 = pcVar4 + lVar9 + 2;
        }
        pcVar4 = pcVar6 + -1;
        for (pcVar11 = pcVar6; cVar1 = *pcVar11, cVar1 != '\0'; pcVar11 = pcVar11 + 1) {
          if (cVar3 == '\"') {
            if (cVar1 == '\"') {
              for (uVar12 = 0; (pcVar6 <= pcVar4 + uVar12 && (pcVar4[uVar12] == '\\'));
                  uVar12 = uVar12 - 1) {
              }
              if ((uVar12 & 1) == 0) break;
            }
          }
          else {
            iVar8 = (iVar8 + (uint)(cVar1 == '<')) - (uint)(cVar1 == '>');
            if (iVar8 == 0) {
              iVar8 = 0;
              break;
            }
            if ((cVar1 == ',') && (iVar8 == 1)) {
              iVar8 = 1;
              break;
            }
          }
          pcVar4 = pcVar4 + 1;
        }
        uVar12 = (ulong)(cVar3 == '\"');
        bcf_hrec_set_val(hrec,hrec->nkeys + -1,pcVar6,(int)pcVar11 - (int)pcVar6,
                         (uint)(cVar3 == '\"'));
        bVar13 = pcVar11[uVar12] == '>';
        pcVar4 = pcVar11 + bVar13 + uVar12;
        iVar8 = iVar8 - (uint)bVar13;
        cVar3 = pcVar11[bVar13 + uVar12];
      }
      pbVar7 = (byte *)(pcVar4 + lVar9 + 2);
      iVar8 = ((int)pcVar4 - (int)line) + len_00;
      while (((char)uVar12 != '\0' && (((uint)uVar12 & 0xff) != 10))) {
        bVar2 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        iVar8 = iVar8 + 1;
        uVar12 = (ulong)bVar2;
      }
      tmp.l = 0;
      tmp.m = 0;
      tmp.s = (char *)0x0;
      kputsn(line,iVar8 + 1,&tmp);
      pcVar4 = tmp.s;
      fprintf(_stderr,"Could not parse the header line: \"%s\"\n",tmp.s);
      free(pcVar4);
      *len = iVar8 + 2;
      bcf_hrec_destroy(hrec);
    }
    else {
      *len = (int)lVar9 + 3;
    }
  }
  else {
    *len = 0;
  }
  return (bcf_hrec_t *)0x0;
}

Assistant:

bcf_hrec_t *bcf_hdr_parse_line(const bcf_hdr_t *h, const char *line, int *len)
{
    const char *p = line;
    if (p[0] != '#' || p[1] != '#') { *len = 0; return NULL; }
    p += 2;

    const char *q = p;
    while ( *q && *q!='=' ) q++;
    int n = q-p;
    if ( *q!='=' || !n ) { *len = q-line+1; return NULL; } // wrong format

    bcf_hrec_t *hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    hrec->key = (char*) malloc(sizeof(char)*(n+1));
    memcpy(hrec->key,p,n);
    hrec->key[n] = 0;

    p = ++q;
    if ( *p!='<' ) // generic field, e.g. ##samtoolsVersion=0.1.18-r579
    {
        while ( *q && *q!='\n' ) q++;
        hrec->value = (char*) malloc((q-p+1)*sizeof(char));
        memcpy(hrec->value, p, q-p);
        hrec->value[q-p] = 0;
        *len = q-line+1;
        return hrec;
    }

    // structured line, e.g. ##INFO=<ID=PV1,Number=1,Type=Float,Description="P-value for baseQ bias">
    int nopen = 1;
    while ( *q && *q!='\n' && nopen )
    {
        p = ++q;
        while ( *q && isalnum(*q) ) q++;
        n = q-p;
        if ( *q!='=' || !n )
        {
            // wrong format
            while ( *q && *q!='\n' ) q++;
            kstring_t tmp = {0,0,0};
            kputsn(line,q-line,&tmp);
            fprintf(stderr,"Could not parse the header line: \"%s\"\n", tmp.s);
            free(tmp.s);
            *len = q-line+1;
            bcf_hrec_destroy(hrec);
            return NULL;
        }
        bcf_hrec_add_key(hrec, p, q-p);
        p = ++q;
        int quoted = *p=='"' ? 1 : 0;
        if ( quoted ) p++, q++;
        while (1)
        {
            if ( !*q ) break;
            if ( quoted ) { if ( *q=='"' && !is_escaped(p,q) ) break; }
            else
            {
                if ( *q=='<' ) nopen++;
                if ( *q=='>' ) nopen--;
                if ( !nopen ) break;
                if ( *q==',' && nopen==1 ) break;
            }
            q++;
        }
        bcf_hrec_set_val(hrec, hrec->nkeys-1, p, q-p, quoted);
        if ( quoted ) q++;
        if ( *q=='>' ) { nopen--; q++; }
    }
    *len = q-line+1;
    return hrec;
}